

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::PoolingLayerParams::SerializeWithCachedSizes
          (PoolingLayerParams *this,CodedOutputStream *output)

{
  byte *pbVar1;
  uint8 *puVar2;
  bool bVar3;
  int iVar4;
  uint32 uVar5;
  unsigned_long *puVar6;
  int iVar7;
  byte *pbVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  
  if (this->type_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(1,this->type_,output);
  }
  if (0 < (this->kernelsize_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x52);
      iVar4 = output->buffer_size_;
    }
    else {
      *output->buffer_ = 'R';
      output->buffer_ = output->buffer_ + 1;
      iVar4 = output->buffer_size_ + -1;
      output->buffer_size_ = iVar4;
    }
    uVar13 = this->_kernelsize_cached_byte_size_;
    if (iVar4 < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar13);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar8 = pbVar1;
      uVar9 = uVar13;
      if (0x7f < uVar13) {
        do {
          *pbVar8 = (byte)uVar13 | 0x80;
          uVar9 = uVar13 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar3 = 0x3fff < uVar13;
          uVar13 = uVar9;
        } while (bVar3);
      }
      *pbVar8 = (byte)uVar9;
      iVar4 = ((int)pbVar8 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
    iVar4 = (this->kernelsize_).current_size_;
    if (0 < iVar4) {
      iVar12 = 0;
      do {
        puVar6 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->kernelsize_,iVar12);
        uVar11 = *puVar6;
        if (output->buffer_size_ < 10) {
          google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,uVar11);
        }
        else {
          pbVar1 = output->buffer_;
          pbVar8 = pbVar1;
          uVar10 = uVar11;
          if (0x7f < uVar11) {
            do {
              *pbVar8 = (byte)uVar11 | 0x80;
              uVar10 = uVar11 >> 7;
              pbVar8 = pbVar8 + 1;
              bVar3 = 0x3fff < uVar11;
              uVar11 = uVar10;
            } while (bVar3);
          }
          *pbVar8 = (byte)uVar10;
          iVar7 = ((int)pbVar8 - (int)pbVar1) + 1;
          output->buffer_ = output->buffer_ + iVar7;
          output->buffer_size_ = output->buffer_size_ - iVar7;
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 != iVar4);
    }
  }
  if (0 < (this->stride_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0xa2);
      iVar4 = output->buffer_size_;
    }
    else {
      puVar2 = output->buffer_;
      puVar2[0] = 0xa2;
      puVar2[1] = '\x01';
      output->buffer_ = output->buffer_ + 2;
      iVar4 = output->buffer_size_ + -2;
      output->buffer_size_ = iVar4;
    }
    uVar13 = this->_stride_cached_byte_size_;
    if (iVar4 < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar13);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar8 = pbVar1;
      uVar9 = uVar13;
      if (0x7f < uVar13) {
        do {
          *pbVar8 = (byte)uVar13 | 0x80;
          uVar9 = uVar13 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar3 = 0x3fff < uVar13;
          uVar13 = uVar9;
        } while (bVar3);
      }
      *pbVar8 = (byte)uVar9;
      iVar4 = ((int)pbVar8 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
    iVar4 = (this->stride_).current_size_;
    if (0 < iVar4) {
      iVar12 = 0;
      do {
        puVar6 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->stride_,iVar12);
        uVar11 = *puVar6;
        if (output->buffer_size_ < 10) {
          google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,uVar11);
        }
        else {
          pbVar1 = output->buffer_;
          pbVar8 = pbVar1;
          uVar10 = uVar11;
          if (0x7f < uVar11) {
            do {
              *pbVar8 = (byte)uVar11 | 0x80;
              uVar10 = uVar11 >> 7;
              pbVar8 = pbVar8 + 1;
              bVar3 = 0x3fff < uVar11;
              uVar11 = uVar10;
            } while (bVar3);
          }
          *pbVar8 = (byte)uVar10;
          iVar7 = ((int)pbVar8 - (int)pbVar1) + 1;
          output->buffer_ = output->buffer_ + iVar7;
          output->buffer_size_ = output->buffer_size_ - iVar7;
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 != iVar4);
    }
  }
  uVar5 = this->_oneof_case_[0];
  if (uVar5 == 0x1e) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1e,&((this->PoolingPaddingType_).valid_)->super_MessageLite,output);
    uVar5 = this->_oneof_case_[0];
  }
  if (uVar5 == 0x1f) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1f,&((this->PoolingPaddingType_).valid_)->super_MessageLite,output);
    uVar5 = this->_oneof_case_[0];
  }
  if (uVar5 == 0x20) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x20,&((this->PoolingPaddingType_).valid_)->super_MessageLite,output);
  }
  if (this->avgpoolexcludepadding_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x32,true,output);
  }
  if (this->globalpooling_ != true) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteBool(0x3c,true,output);
  return;
}

Assistant:

void PoolingLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.PoolingLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.PoolingLayerParams.PoolingType type = 1;
  if (this->type() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->type(), output);
  }

  // repeated uint64 kernelSize = 10;
  if (this->kernelsize_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(10, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_kernelsize_cached_byte_size_);
  }
  for (int i = 0, n = this->kernelsize_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->kernelsize(i), output);
  }

  // repeated uint64 stride = 20;
  if (this->stride_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(20, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_stride_cached_byte_size_);
  }
  for (int i = 0, n = this->stride_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->stride(i), output);
  }

  // .CoreML.Specification.ValidPadding valid = 30;
  if (has_valid()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      30, *PoolingPaddingType_.valid_, output);
  }

  // .CoreML.Specification.SamePadding same = 31;
  if (has_same()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      31, *PoolingPaddingType_.same_, output);
  }

  // .CoreML.Specification.PoolingLayerParams.ValidCompletePadding includeLastPixel = 32;
  if (has_includelastpixel()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      32, *PoolingPaddingType_.includelastpixel_, output);
  }

  // bool avgPoolExcludePadding = 50;
  if (this->avgpoolexcludepadding() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(50, this->avgpoolexcludepadding(), output);
  }

  // bool globalPooling = 60;
  if (this->globalpooling() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(60, this->globalpooling(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.PoolingLayerParams)
}